

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

LispPTR deleteblock(LispPTR base)

{
  DLword *pDVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  DLword *pDVar5;
  DLword *pDVar6;
  ulong uVar7;
  int cnt;
  uint uVar8;
  uint uVar10;
  int iVar9;
  
  if ((base & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  pDVar1 = Lisp_world;
  if (Lisp_world[base] < 4) {
    return 0;
  }
  uVar3 = *(uint *)(Lisp_world + (ulong)base + 2);
  if ((ulong)uVar3 == 0) {
    return 0;
  }
  if ((uVar3 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  pDVar5 = Lisp_world;
  uVar4 = *(uint *)(pDVar1 + (ulong)base + 4);
  if ((uVar4 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  pDVar6 = Lisp_world;
  uVar2 = pDVar1[base];
  uVar7 = (ulong)uVar2;
  uVar8 = (uint)uVar2;
  if (uVar8 < 3) {
    uVar8 = (uint)uVar2;
  }
  else {
    uVar10 = 0;
    do {
      uVar8 = uVar8 >> 1;
      uVar10 = uVar10 + 1;
    } while (uVar8 != 1);
    iVar9 = 0x3c;
    if (0x1d < uVar10) goto LAB_001234ab;
    uVar8 = 1;
    do {
      uVar8 = uVar8 + 1;
      uVar7 = uVar7 >> 1;
    } while ((int)uVar7 != 1);
  }
  iVar9 = uVar8 * 2;
LAB_001234ab:
  uVar8 = iVar9 + (*FreeBlockBuckets_word & 0xfffffff);
  if ((*FreeBlockBuckets_word & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
  }
  if (uVar3 == base) {
    if ((*(uint *)(Lisp_world + uVar8) & 0xfffffff) == base) {
      pDVar1 = Lisp_world + uVar8;
      pDVar1[0] = 0;
      pDVar1[1] = 0;
    }
    else {
      error("GC error:deleting last list # FREEBLOCKLIST\n");
    }
  }
  else {
    if ((*(uint *)(Lisp_world + uVar8) & 0xfffffff) == base) {
      *(uint *)(Lisp_world + uVar8) = uVar3;
    }
    *(uint *)(pDVar5 + (ulong)uVar3 + 4) = uVar4;
    *(uint *)(pDVar6 + (ulong)uVar4 + 2) = uVar3;
  }
  return 0;
}

Assistant:

LispPTR deleteblock(LispPTR base) {
  struct arrayblock *bbase, *fbbase, *bbbase;
  LispPTR fwd, bkwd, fbl, freeblocklsp;
  LispPTR *freeblock;
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  if ((bbase->arlen >= MINARRAYBLOCKSIZE) && (bbase->fwd != NIL)) {
    fwd = bbase->fwd;
    fbbase = (struct arrayblock *)NativeAligned4FromLAddr(fwd);
    bkwd = bbase->bkwd;
    bbbase = (struct arrayblock *)NativeAligned4FromLAddr(bkwd);
    fbl = FreeBlockChainN(bbase->arlen);
    freeblock = (LispPTR *)NativeAligned4FromLAddr(fbl);
    freeblocklsp = POINTERMASK & *freeblock;
    if (base == fwd) {
      if (base == freeblocklsp)
        *freeblock = NIL;
      else
        error("GC error:deleting last list # FREEBLOCKLIST\n");
      return (NIL);
    } else if (base == freeblocklsp)
      *freeblock = fwd;
    fbbase->bkwd = bkwd;
    bbbase->fwd = fwd;
  }
  return (NIL);
}